

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O1

bool __thiscall ON_WindowsBitmap::WriteUncompressed(ON_WindowsBitmap *this,ON_BinaryArchive *file)

{
  unsigned_short s;
  ON_WindowsBITMAPINFO *pOVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ON__INT32 i;
  unsigned_short uVar4;
  ulong uVar5;
  int i_00;
  uint uVar6;
  uint local_48;
  uint local_44;
  ON__INT32 local_40;
  ON__INT32 local_3c;
  uint local_38;
  uint local_34;
  
  pOVar1 = this->m_bmi;
  if (pOVar1 == (ON_WindowsBITMAPINFO *)0x0) {
    i_00 = 0;
    uVar4 = 0;
    s = 0;
    local_48 = 0;
    local_44 = 0;
    local_40 = 0;
    local_3c = 0;
    local_38 = 0;
    local_34 = 0;
    iVar3 = 0;
    i = 0;
  }
  else {
    iVar3 = (pOVar1->bmiHeader).biWidth;
    i_00 = (pOVar1->bmiHeader).biHeight;
    uVar4 = (pOVar1->bmiHeader).biPlanes;
    s = (pOVar1->bmiHeader).biBitCount;
    local_48 = (pOVar1->bmiHeader).biCompression;
    local_44 = (pOVar1->bmiHeader).biSizeImage;
    local_40 = (pOVar1->bmiHeader).biXPelsPerMeter;
    local_3c = (pOVar1->bmiHeader).biYPelsPerMeter;
    local_38 = (pOVar1->bmiHeader).biClrUsed;
    local_34 = (pOVar1->bmiHeader).biClrImportant;
    i = 0x28;
  }
  bVar2 = ON_BinaryArchive::WriteInt(file,i);
  if (bVar2) {
    bVar2 = ON_BinaryArchive::WriteInt(file,iVar3);
  }
  if (bVar2 != false) {
    bVar2 = ON_BinaryArchive::WriteInt(file,i_00);
  }
  if (bVar2 != false) {
    bVar2 = ON_BinaryArchive::WriteShort(file,uVar4);
  }
  if (bVar2 != false) {
    bVar2 = ON_BinaryArchive::WriteShort(file,s);
  }
  if (bVar2 != false) {
    bVar2 = ON_BinaryArchive::WriteInt(file,local_48);
  }
  if (bVar2 != false) {
    bVar2 = ON_BinaryArchive::WriteInt(file,local_44);
  }
  if (bVar2 != false) {
    bVar2 = ON_BinaryArchive::WriteInt(file,local_40);
  }
  if (bVar2 != false) {
    bVar2 = ON_BinaryArchive::WriteInt(file,local_3c);
  }
  if (bVar2 != false) {
    bVar2 = ON_BinaryArchive::WriteInt(file,local_38);
  }
  if (bVar2 != false) {
    bVar2 = ON_BinaryArchive::WriteInt(file,local_34);
  }
  if (bVar2 != false) {
    pOVar1 = this->m_bmi;
    uVar6 = 0;
    if ((pOVar1 != (ON_WindowsBITMAPINFO *)0x0) &&
       (uVar6 = (pOVar1->bmiHeader).biClrUsed, uVar6 == 0)) {
      uVar4 = (pOVar1->bmiHeader).biBitCount;
      if (uVar4 == 1) {
        uVar6 = 2;
      }
      else if (uVar4 == 8) {
        uVar6 = 0x100;
      }
      else if (uVar4 == 4) {
        uVar6 = 0x10;
      }
      else {
        uVar6 = 0;
      }
    }
    if (bVar2 == true && 0 < (int)uVar6) {
      uVar5 = 0;
      do {
        bVar2 = ON_BinaryArchive::WriteChar(file,this->m_bmi->bmiColors[uVar5].rgbBlue);
        if (bVar2) {
          bVar2 = ON_BinaryArchive::WriteChar(file,this->m_bmi->bmiColors[uVar5].rgbGreen);
        }
        if (bVar2 != false) {
          bVar2 = ON_BinaryArchive::WriteChar(file,this->m_bmi->bmiColors[uVar5].rgbRed);
        }
        if (bVar2 != false) {
          bVar2 = ON_BinaryArchive::WriteChar(file,this->m_bmi->bmiColors[uVar5].rgbReserved);
        }
        uVar5 = uVar5 + 1;
      } while ((uVar5 < uVar6) && (bVar2 != false));
    }
    iVar3 = (*(this->super_ON_Bitmap).super_ON_ModelComponent.super_ON_Object._vptr_ON_Object[0x1c])
                      (this);
    if (bVar2 == true && CONCAT44(extraout_var,iVar3) != 0) {
      bVar2 = ON_BinaryArchive::WriteByte
                        (file,CONCAT44(extraout_var,iVar3),this->m_bmi->bmiColors + (int)uVar6);
      return bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool ON_WindowsBitmap::WriteUncompressed( ON_BinaryArchive& file ) const
{
#if defined(ON_OS_WINDOWS_GDI)
  BITMAPINFOHEADER bmiHeader;
#else
  ON_WindowsBITMAPINFOHEADER bmiHeader;
#endif

  if ( m_bmi )
  {
    bmiHeader = m_bmi->bmiHeader;
    bmiHeader.biSize = sizeof(bmiHeader);
  }
  else 
  {
    memset(&bmiHeader,0,sizeof(bmiHeader));
  }
  int i;
  short s;
  i = bmiHeader.biSize;
  bool    rc = file.WriteInt(i);
  i = bmiHeader.biWidth;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biHeight;
  if (rc) rc = file.WriteInt(i);
  s = bmiHeader.biPlanes;
  if (rc) rc = file.WriteShort(s);
  s = bmiHeader.biBitCount;
  if (rc) rc = file.WriteShort(s);
  i = bmiHeader.biCompression;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biSizeImage;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biXPelsPerMeter;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biYPelsPerMeter;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biClrUsed;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biClrImportant;
  if (rc) rc = file.WriteInt(i);

  if ( rc ) 
  {
    const int color_count = PaletteColorCount();
    for (i = 0; i < color_count && rc; i++ )
    {
      if (rc) rc = file.WriteChar( m_bmi->bmiColors[i].rgbBlue );
      if (rc) rc = file.WriteChar( m_bmi->bmiColors[i].rgbGreen );
      if (rc) rc = file.WriteChar( m_bmi->bmiColors[i].rgbRed );
      if (rc) rc = file.WriteChar( m_bmi->bmiColors[i].rgbReserved );
    }
    const size_t sizeof_image = SizeofImage();
    if ( sizeof_image > 0 && rc ) 
    {
      if (rc) rc = file.WriteByte( sizeof_image, &m_bmi->bmiColors[color_count] );
    }
  }

  return rc;
}